

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::generateDES3
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,
          CK_OBJECT_HANDLE_PTR phKey,CK_BBOOL isOnToken,CK_BBOOL isPrivate)

{
  ulong uVar1;
  _func_int *p_Var2;
  void *pvVar3;
  DESKey *pDVar4;
  SoftHSM *pSVar5;
  CK_OBJECT_HANDLE_PTR pCVar6;
  char cVar7;
  char cVar8;
  byte bVar9;
  int iVar10;
  Session *this_00;
  Token *pTVar11;
  unsigned_long *puVar12;
  CryptoFactory *pCVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar14;
  long *plVar15;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  CK_ULONG CVar16;
  CK_ULONG CVar17;
  _func_int **pp_Var18;
  bool bVar19;
  CK_ULONG i;
  ulong uVar20;
  bool bVar21;
  CK_RV CStack_480;
  CK_BBOOL isOnToken_local;
  long *local_468;
  DESKey *local_460;
  SoftHSM *local_458;
  long *local_450;
  Token *local_448;
  CK_OBJECT_HANDLE_PTR local_440;
  CK_KEY_TYPE keyType;
  CK_OBJECT_CLASS objClass;
  OSAttribute local_428;
  ByteString kcv;
  ByteString value;
  CK_ATTRIBUTE keyAttribs [32];
  
  *phKey = 0;
  isOnToken_local = isOnToken;
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  pTVar11 = Session::getToken(this_00);
  if (pTVar11 == (Token *)0x0) {
    return 5;
  }
  puVar12 = &pTemplate->ulValueLen;
  bVar19 = true;
  CVar16 = ulCount;
  while (bVar21 = CVar16 != 0, CVar16 = CVar16 - 1, local_458 = this, bVar21) {
    if (((_CK_ATTRIBUTE *)(puVar12 + -2))->type == 0x90) {
      if (*puVar12 != 0) {
        softHSMLog(6,"generateDES3",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0x202f,"CKA_CHECK_VALUE must be a no-value (0 length) entry");
        return 0x13;
      }
      bVar19 = false;
    }
    puVar12 = puVar12 + 3;
  }
  local_460 = (DESKey *)operator_new(0x38);
  DESKey::DESKey(local_460,0xa8);
  pCVar13 = CryptoFactory::i();
  iVar10 = (**pCVar13->_vptr_CryptoFactory)(pCVar13,3);
  local_450 = (long *)CONCAT44(extraout_var,iVar10);
  if (local_450 == (long *)0x0) {
    softHSMLog(3,"generateDES3",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x203e,"Could not get SymmetricAlgorithm");
    (*(local_460->super_SymmetricKey).super_Serialisable._vptr_Serialisable[2])();
    return 5;
  }
  pCVar13 = CryptoFactory::i();
  iVar10 = (*pCVar13->_vptr_CryptoFactory[8])(pCVar13,1);
  plVar14 = local_450;
  if (CONCAT44(extraout_var_00,iVar10) == 0) {
    softHSMLog(3,"generateDES3",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x2045,"Could not get RNG");
    plVar14 = local_450;
    (**(code **)(*local_450 + 0x50))(local_450,local_460);
    pCVar13 = CryptoFactory::i();
    pp_Var18 = pCVar13->_vptr_CryptoFactory;
LAB_0013a480:
    (*pp_Var18[1])(pCVar13,plVar14);
    return 5;
  }
  local_448 = pTVar11;
  cVar7 = (**(code **)(*local_450 + 0x58))(local_450,local_460,CONCAT44(extraout_var_00,iVar10));
  if (cVar7 == '\0') {
    softHSMLog(3,"generateDES3",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x204c,"Could not generate DES secret key");
    (**(code **)(*plVar14 + 0x50))(plVar14,local_460);
    pCVar13 = CryptoFactory::i();
    pp_Var18 = pCVar13->_vptr_CryptoFactory;
    goto LAB_0013a480;
  }
  objClass = 4;
  keyType = 0x15;
  local_440 = phKey;
  memset(keyAttribs,0,0x300);
  pCVar6 = local_440;
  plVar14 = local_450;
  pDVar4 = local_460;
  keyAttribs[0].pValue = &objClass;
  keyAttribs[0].ulValueLen = 8;
  keyAttribs[1].type = 1;
  keyAttribs[1].pValue = &isOnToken_local;
  keyAttribs[1].ulValueLen = 1;
  keyAttribs[2].type = 2;
  keyAttribs[2].pValue = &isPrivate;
  keyAttribs[2].ulValueLen = 1;
  keyAttribs[3].type = 0x100;
  keyAttribs[3].pValue = &keyType;
  keyAttribs[3].ulValueLen = 8;
  CVar16 = 4;
  for (uVar20 = 0; (ulCount < 0x1d && (uVar20 < ulCount)); uVar20 = uVar20 + 1) {
    uVar1 = pTemplate->type;
    CVar17 = CVar16;
    if ((2 < uVar1) && ((uVar1 != 0x90 && (uVar1 != 0x100)))) {
      CVar17 = CVar16 + 1;
      keyAttribs[CVar16].ulValueLen = pTemplate->ulValueLen;
      pvVar3 = pTemplate->pValue;
      keyAttribs[CVar16].type = pTemplate->type;
      keyAttribs[CVar16].pValue = pvVar3;
    }
    pTemplate = pTemplate + 1;
    CVar16 = CVar17;
  }
  CStack_480 = 0xd1;
  if ((0x1c < ulCount) ||
     (CStack_480 = CreateObject(local_458,hSession,keyAttribs,CVar16,local_440,4), CStack_480 != 0))
  goto LAB_0013a4d3;
  plVar15 = (long *)HandleManager::getObject(local_458->handleManager,*pCVar6);
  CStack_480 = 6;
  if ((plVar15 == (long *)0x0) ||
     ((cVar7 = (**(code **)(*plVar15 + 0x50))(plVar15), CStack_480 = 6, cVar7 == '\0' ||
      (cVar7 = (**(code **)(*plVar15 + 0x58))(plVar15,1), cVar7 == '\0')))) goto LAB_0013a4d3;
  OSAttribute::OSAttribute(&local_428,true);
  local_468 = plVar15;
  cVar7 = (**(code **)(*plVar15 + 0x40))(plVar15,0x163,&local_428);
  OSAttribute::~OSAttribute(&local_428);
  if (cVar7 == '\0') {
    cVar7 = '\0';
  }
  else {
    OSAttribute::OSAttribute(&local_428,0x131);
    cVar7 = (**(code **)(*local_468 + 0x40))(local_468,0x166,&local_428);
    OSAttribute::~OSAttribute(&local_428);
  }
  plVar15 = local_468;
  bVar21 = (bool)(**(code **)(*local_468 + 0x20))(local_468,0x103,0);
  cVar8 = '\0';
  if (cVar7 != '\0') {
    OSAttribute::OSAttribute(&local_428,bVar21);
    cVar8 = (**(code **)(*plVar15 + 0x40))(plVar15,0x165,&local_428);
    OSAttribute::~OSAttribute(&local_428);
  }
  cVar7 = '\0';
  bVar9 = (**(code **)(*plVar15 + 0x20))(plVar15,0x162,0);
  if (cVar8 != '\0') {
    OSAttribute::OSAttribute(&local_428,(bool)(bVar9 ^ 1));
    cVar7 = (**(code **)(*local_468 + 0x40))(local_468,0x164,&local_428);
    OSAttribute::~OSAttribute(&local_428);
  }
  ByteString::ByteString(&value);
  ByteString::ByteString(&kcv);
  p_Var2 = (pDVar4->super_SymmetricKey).super_Serialisable._vptr_Serialisable[4];
  if (isPrivate == '\0') {
    iVar10 = (*p_Var2)(pDVar4);
    ByteString::operator=(&value,(ByteString *)CONCAT44(extraout_var_02,iVar10));
    (*(pDVar4->super_SymmetricKey).super_Serialisable._vptr_Serialisable[5])(&local_428,pDVar4);
    ByteString::operator=(&kcv,(ByteString *)&local_428);
  }
  else {
    iVar10 = (*p_Var2)(pDVar4);
    Token::encrypt(local_448,(char *)CONCAT44(extraout_var_01,iVar10),(int)&value);
    (*(pDVar4->super_SymmetricKey).super_Serialisable._vptr_Serialisable[5])(&local_428,pDVar4);
    Token::encrypt(local_448,(char *)&local_428,(int)&kcv);
  }
  ByteString::~ByteString((ByteString *)&local_428);
  if (cVar7 == '\0') {
LAB_0013a7d1:
    (**(code **)(*local_468 + 0x68))();
    cVar7 = '\0';
  }
  else {
    OSAttribute::OSAttribute(&local_428,&value);
    cVar7 = (**(code **)(*local_468 + 0x40))(local_468,0x11,&local_428);
    OSAttribute::~OSAttribute(&local_428);
    if (bVar19) {
      if (cVar7 == '\0') goto LAB_0013a7d1;
      OSAttribute::OSAttribute(&local_428,&kcv);
      cVar7 = (**(code **)(*local_468 + 0x40))(local_468,0x90,&local_428);
      OSAttribute::~OSAttribute(&local_428);
    }
    if (cVar7 == '\0') goto LAB_0013a7d1;
    cVar7 = (**(code **)(*local_468 + 0x60))();
  }
  ByteString::~ByteString(&kcv);
  ByteString::~ByteString(&value);
  CStack_480 = 6;
  if (cVar7 != '\0') {
    CStack_480 = 0;
  }
LAB_0013a4d3:
  (**(code **)(*plVar14 + 0x50))(plVar14,pDVar4);
  pCVar13 = CryptoFactory::i();
  (*pCVar13->_vptr_CryptoFactory[1])(pCVar13,plVar14);
  pSVar5 = local_458;
  if (CStack_480 == 0) {
    return 0;
  }
  if (*pCVar6 != 0) {
    plVar14 = (long *)HandleManager::getObject(local_458->handleManager,*pCVar6);
    HandleManager::destroyObject(pSVar5->handleManager,*pCVar6);
    if (plVar14 != (long *)0x0) {
      (**(code **)(*plVar14 + 0x70))(plVar14);
    }
    *pCVar6 = 0;
    return CStack_480;
  }
  return CStack_480;
}

Assistant:

CK_RV SoftHSM::generateDES3
(CK_SESSION_HANDLE hSession,
	CK_ATTRIBUTE_PTR pTemplate,
	CK_ULONG ulCount,
	CK_OBJECT_HANDLE_PTR phKey,
	CK_BBOOL isOnToken,
	CK_BBOOL isPrivate)
{
	*phKey = CK_INVALID_HANDLE;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL)
		return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL)
		return CKR_GENERAL_ERROR;

	// Extract desired parameter information
	bool checkValue = true;
	for (CK_ULONG i = 0; i < ulCount; i++)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CHECK_VALUE:
				if (pTemplate[i].ulValueLen > 0)
				{
					INFO_MSG("CKA_CHECK_VALUE must be a no-value (0 length) entry");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				checkValue = false;
				break;
			default:
				break;
		}
	}

	// Generate the secret key
	DESKey* key = new DESKey(168);
	SymmetricAlgorithm* des = CryptoFactory::i()->getSymmetricAlgorithm(SymAlgo::DES3);
	if (des == NULL)
	{
		ERROR_MSG("Could not get SymmetricAlgorithm");
		delete key;
		return CKR_GENERAL_ERROR;
	}
	RNG* rng = CryptoFactory::i()->getRNG();
	if (rng == NULL)
	{
		ERROR_MSG("Could not get RNG");
		des->recycleKey(key);
		CryptoFactory::i()->recycleSymmetricAlgorithm(des);
		return CKR_GENERAL_ERROR;
	}
	if (!des->generateKey(*key, rng))
	{
		ERROR_MSG("Could not generate DES secret key");
		des->recycleKey(key);
		CryptoFactory::i()->recycleSymmetricAlgorithm(des);
		return CKR_GENERAL_ERROR;
	}

	CK_RV rv = CKR_OK;

	// Create the secret key object using C_CreateObject
	const CK_ULONG maxAttribs = 32;
	CK_OBJECT_CLASS objClass = CKO_SECRET_KEY;
	CK_KEY_TYPE keyType = CKK_DES3;
	CK_ATTRIBUTE keyAttribs[maxAttribs] = {
		{ CKA_CLASS, &objClass, sizeof(objClass) },
		{ CKA_TOKEN, &isOnToken, sizeof(isOnToken) },
		{ CKA_PRIVATE, &isPrivate, sizeof(isPrivate) },
		{ CKA_KEY_TYPE, &keyType, sizeof(keyType) },
	};
	CK_ULONG keyAttribsCount = 4;

	// Add the additional
	if (ulCount > (maxAttribs - keyAttribsCount))
		rv = CKR_TEMPLATE_INCONSISTENT;
	for (CK_ULONG i=0; i < ulCount && rv == CKR_OK; ++i)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CLASS:
			case CKA_TOKEN:
			case CKA_PRIVATE:
			case CKA_KEY_TYPE:
			case CKA_CHECK_VALUE:
				continue;
		default:
			keyAttribs[keyAttribsCount++] = pTemplate[i];
		}
	}

	if (rv == CKR_OK)
		rv = this->CreateObject(hSession, keyAttribs, keyAttribsCount, phKey,OBJECT_OP_GENERATE);

	// Store the attributes that are being supplied
	if (rv == CKR_OK)
	{
		OSObject* osobject = (OSObject*)handleManager->getObject(*phKey);
		if (osobject == NULL_PTR || !osobject->isValid()) {
			rv = CKR_FUNCTION_FAILED;
		} else if (osobject->startTransaction()) {
			bool bOK = true;

			// Common Attributes
			bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
			CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_DES3_KEY_GEN;
			bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

			// Common Secret Key Attributes
			bool bAlwaysSensitive = osobject->getBooleanValue(CKA_SENSITIVE, false);
			bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE,bAlwaysSensitive);
			bool bNeverExtractable = osobject->getBooleanValue(CKA_EXTRACTABLE, false) == false;
			bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE, bNeverExtractable);

			// DES Secret Key Attributes
			ByteString value;
			ByteString kcv;
			if (isPrivate)
			{
				token->encrypt(key->getKeyBits(), value);
				token->encrypt(key->getKeyCheckValue(), kcv);
			}
			else
			{
				value = key->getKeyBits();
				kcv = key->getKeyCheckValue();
			}
			bOK = bOK && osobject->setAttribute(CKA_VALUE, value);
			if (checkValue)
				bOK = bOK && osobject->setAttribute(CKA_CHECK_VALUE, kcv);

			if (bOK)
				bOK = osobject->commitTransaction();
			else
				osobject->abortTransaction();

			if (!bOK)
				rv = CKR_FUNCTION_FAILED;
		} else
			rv = CKR_FUNCTION_FAILED;
	}

	// Clean up
	des->recycleKey(key);
	CryptoFactory::i()->recycleSymmetricAlgorithm(des);

	// Remove the key that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*phKey != CK_INVALID_HANDLE)
		{
			OSObject* oskey = (OSObject*)handleManager->getObject(*phKey);
			handleManager->destroyObject(*phKey);
			if (oskey) oskey->destroyObject();
			*phKey = CK_INVALID_HANDLE;
		}
	}

	return rv;
}